

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_easy_api.cc
# Opt level: O0

bool __thiscall ModelBuilder::Check(ModelBuilder *this,NLSolution *sol)

{
  bool bVar1;
  size_type __n;
  reference pvVar2;
  double in_RSI;
  long in_RDI;
  size_type i;
  double in_stack_ffffffffffffffc8;
  value_type vVar3;
  size_type local_20;
  
  bVar1 = ApproxEqual(in_RSI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    __n = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)((long)in_RSI + 0x30));
    do {
      local_20 = __n;
      __n = local_20 - 1;
      if (local_20 == 0) {
        printf("MIQP 1: solution check ok, obj=%.17g.\n",*(undefined8 *)((long)in_RSI + 0x28));
        return true;
      }
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x180),__n);
      vVar3 = *pvVar2;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)((long)in_RSI + 0x30),__n);
      bVar1 = ApproxEqual(in_RSI,vVar3);
    } while (bVar1);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)in_RSI + 0x30),__n);
    vVar3 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x180),__n);
    printf("MIQP 1: wrong x[%ld] (%.17g !~ %.17g)\n",vVar3,*pvVar2,local_20);
  }
  else {
    printf("MIQP 1: wrong obj val (%.17g !~ %.17g)\n",*(undefined8 *)((long)in_RSI + 0x28),
           *(undefined8 *)(in_RDI + 0x198));
  }
  return false;
}

Assistant:

bool Check(mp::NLSolution sol) {
    if (!ApproxEqual(sol.obj_val_, obj_val_ref_)) {
      printf("MIQP 1: wrong obj val (%.17g !~ %.17g)\n",
             sol.obj_val_, obj_val_ref_);
      return false;
    }
    for (auto i=sol.x_.size(); i--; )
      if (!ApproxEqual(x_ref_[i], sol.x_[i])) {
        printf("MIQP 1: wrong x[%ld] (%.17g !~ %.17g)\n",
               i+1, sol.x_[i], x_ref_[i]);
        return false;
      }
    printf("MIQP 1: solution check ok, obj=%.17g.\n",
           sol.obj_val_);
    return true;
  }